

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileManager::DeleteTemporaryBuffer(TemporaryFileManager *this,block_id_t id)

{
  TemporaryFileIndex index_00;
  TemporaryFileHandle *handle_00;
  TemporaryFileManagerLock *extraout_RDX;
  TemporaryFileManagerLock lock;
  TemporaryFileIndex index;
  optional_ptr<duckdb::TemporaryFileHandle,_true> handle;
  lock_guard<std::mutex> local_38;
  TemporaryFileIndex local_30;
  optional_ptr<duckdb::TemporaryFileHandle,_true> local_18;
  
  TemporaryFileManagerLock::TemporaryFileManagerLock
            ((TemporaryFileManagerLock *)&local_38,&this->manager_lock);
  GetTempBlockIndex(&local_30,this,extraout_RDX,id);
  local_18 = TemporaryFileMap::GetFile(&this->files,&local_30.identifier);
  handle_00 = optional_ptr<duckdb::TemporaryFileHandle,_true>::operator*(&local_18);
  index_00.identifier.file_index.index = local_30.identifier.file_index.index;
  index_00.identifier.size = local_30.identifier.size;
  index_00.block_index.index = local_30.block_index.index;
  EraseUsedBlock(this,(TemporaryFileManagerLock *)&local_38,id,handle_00,index_00);
  pthread_mutex_unlock((pthread_mutex_t *)local_38._M_device);
  return;
}

Assistant:

void TemporaryFileManager::DeleteTemporaryBuffer(block_id_t id) {
	TemporaryFileManagerLock lock(manager_lock);
	auto index = GetTempBlockIndex(lock, id);
	auto handle = GetFileHandle(lock, index.identifier);
	EraseUsedBlock(lock, id, *handle, index);
}